

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O1

int __thiscall
ProgramStreamDemuxer::simpleDemuxBlock
          (ProgramStreamDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,
          int64_t *discardSize)

{
  uint32_t *puVar1;
  byte bVar2;
  pointer puVar3;
  ushort uVar4;
  int iVar5;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ulong *puVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *buff;
  undefined4 *puVar11;
  long lVar12;
  _Base_ptr p_Var13;
  _Rb_tree_header *p_Var14;
  ushort uVar15;
  _Base_ptr p_Var16;
  _Rb_tree_header *p_Var17;
  uint uVar18;
  PIDSet *pPVar19;
  void *pvVar20;
  byte *pbVar21;
  map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
  *this_00;
  uint uVar22;
  size_t sVar23;
  ProgramStreamDemuxer *this_01;
  uint uVar24;
  uint32_t uVar25;
  void *__src;
  byte *end;
  ulong uVar26;
  long *plVar27;
  bool bVar28;
  int startcode;
  uint32_t readedBytes;
  int afterPesHeader;
  int readRez;
  ostringstream ss;
  uint local_23c;
  uint local_238;
  uint local_234;
  byte *local_230;
  byte *local_228;
  int local_21c;
  map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
  *local_218;
  ProgramStreamDemuxer *local_210;
  PIDSet *local_208;
  long *local_200;
  int local_1f4;
  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_> *local_1f0;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  _Rb_tree_header *local_1c8;
  mapped_type *local_1c0;
  MemoryBlock *local_1b8;
  _Base_ptr local_1b0;
  ostringstream local_1a8 [376];
  
  *discardSize = 0;
  local_234 = 0;
  local_1f4 = 0;
  iVar5 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_234,&local_1f4,0);
  if (local_1f4 == 2) {
    this->m_lastReadRez = 2;
    uVar18 = 2;
  }
  else if ((this->m_tmpBufferLen + local_234 == 0) ||
          ((local_234 == 0 && (this->m_lastReadRez == 1)))) {
    this->m_lastReadRez = local_1f4;
    uVar18 = 1;
  }
  else {
    if (local_234 != 0) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
    }
    this->m_lastReadRez = local_1f4;
    uVar26 = (ulong)this->m_tmpBufferLen;
    if (0x3fa < uVar26) {
      __assert_fail("m_tmpBufferLen <= MAX_PES_HEADER_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/programStreamDemuxer.cpp"
                    ,0xda,
                    "virtual int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData &, const PIDSet &, int64_t &)"
                   );
    }
    __src = (void *)(CONCAT44(extraout_var,iVar5) + 0x3fa);
    local_208 = acceptedPIDs;
    if (uVar26 != 0) {
      memcpy((void *)((long)__src - uVar26),this->m_tmpBuffer,uVar26);
      __src = (void *)((long)__src - (ulong)this->m_tmpBufferLen);
      local_234 = local_234 + this->m_tmpBufferLen;
      this->m_tmpBufferLen = 0;
    }
    uVar22 = local_234;
    uVar26 = (ulong)local_234;
    uVar18 = this->m_lastPesLen;
    pvVar20 = __src;
    local_218 = demuxedData;
    local_210 = this;
    local_200 = discardSize;
    if (uVar18 != 0) {
      if (local_234 < uVar18) {
        uVar18 = local_234;
      }
      if (0 < this->m_lastPID) {
        pmVar6 = std::
                 map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                 ::operator[](demuxedData,&this->m_lastPID);
        sVar23 = (size_t)(int)uVar18;
        if (uVar22 != 0) {
          MemoryBlock::grow(pmVar6,sVar23);
          memcpy((pmVar6->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (pmVar6->m_size - sVar23),__src,sVar23);
        }
        discardSize = &local_210->m_dataProcessed;
      }
      *discardSize = *discardSize + (long)(int)uVar18;
      puVar1 = &local_210->m_lastPesLen;
      *puVar1 = *puVar1 - uVar18;
      local_238 = (uint)(local_234 == 0);
      if (*puVar1 != 0) {
        return local_238;
      }
      pvVar20 = (void *)((long)(int)uVar18 + (long)__src);
    }
    end = (byte *)((long)__src + uVar26);
    for (pbVar21 = (byte *)((long)pvVar20 + 2); buff = end, pbVar21 < end;
        pbVar21 = pbVar21 + lVar12) {
      lVar12 = 3;
      if (*pbVar21 < 2) {
        if (*pbVar21 == 0) {
          lVar12 = 1;
        }
        else if ((pbVar21[-2] == 0) && (pbVar21[-1] == 0)) {
          buff = pbVar21 + -2;
          break;
        }
      }
    }
    *local_200 = (long)(buff + (*local_200 - (long)pvVar20));
    pbVar21 = end + -9;
    local_1b0 = &(local_208->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_1f0 = &local_210->m_firstPtsTime;
    local_1c8 = &(local_210->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
    local_1b8 = local_210->m_lpcmWaveHeader;
    pPVar19 = local_208;
    this_00 = local_218;
    this_01 = local_210;
    plVar27 = local_200;
    local_228 = pbVar21;
    do {
      if (pbVar21 < buff) goto LAB_001c8d80;
      bVar2 = buff[3];
      local_23c = (uint)bVar2;
      bVar28 = 0x30 < (byte)(bVar2 + 0x41);
      if (bVar28 && (bVar2 & 0xbf) != 0xbd) {
        if (bVar2 == 0xbc) {
          uVar18 = mpegps_psm_parse(this_01,buff,end);
          if (uVar18 == 0xffffffff) {
            iVar5 = 3;
            bVar28 = false;
          }
          else {
            uVar26 = (ulong)uVar18;
            lVar12 = (long)end - (long)buff;
            if (lVar12 < (long)uVar26) {
              *plVar27 = *plVar27 + lVar12;
              this_01->m_lastPID = 0;
              this_01->m_lastPesLen = uVar18 - (int)lVar12;
              bVar28 = false;
              iVar5 = 1;
              local_238 = 0;
            }
            else {
              *plVar27 = *plVar27 + uVar26;
              buff = buff + uVar26;
              iVar5 = 0;
              bVar28 = true;
            }
          }
          pbVar21 = local_228;
          if (!bVar28) goto LAB_001c8d68;
        }
        else {
          lVar12 = (long)end - (long)buff;
          if (3 < lVar12) {
            lVar12 = 4;
          }
          buff = buff + lVar12;
          *plVar27 = *plVar27 + lVar12;
        }
LAB_001c8d20:
        for (pbVar9 = buff + 2; pbVar10 = end, pbVar9 < end; pbVar9 = pbVar9 + lVar12) {
          lVar12 = 3;
          if (*pbVar9 < 2) {
            if (*pbVar9 == 0) {
              lVar12 = 1;
            }
            else if ((pbVar9[-2] == 0) && (pbVar9[-1] == 0)) {
              pbVar10 = pbVar9 + -2;
              break;
            }
          }
        }
        *plVar27 = (long)(pbVar10 + (*plVar27 - (long)buff));
        iVar5 = 0;
        buff = pbVar10;
      }
      else {
        iVar5 = 3;
        if (buff + (ulong)(byte)(buff[8] + 9) + 4 <= end) {
          local_21c = 0;
          local_23c = processPES(this_01,buff,
                                 (uint8_t *)(ulong)CONCAT31((int3)(bVar2 + 0x41 >> 8),bVar28),
                                 &local_21c);
          p_Var13 = local_1b0;
          for (p_Var16 = (pPVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var16 != (_Base_ptr)0x0;
              p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < (int)local_23c]) {
            if ((int)local_23c <= (int)p_Var16[1]._M_color) {
              p_Var13 = p_Var16;
            }
          }
          p_Var16 = local_1b0;
          if ((p_Var13 != local_1b0) &&
             (p_Var16 = p_Var13, (int)local_23c < (int)p_Var13[1]._M_color)) {
            p_Var16 = local_1b0;
          }
          if (p_Var16 == local_1b0) {
            uVar15 = *(ushort *)(buff + 4) << 8 | *(ushort *)(buff + 4) >> 8;
            uVar4 = uVar15 + 6;
            if (uVar15 == 0) {
              uVar4 = 0;
            }
            uVar26 = (ulong)uVar4;
            lVar12 = (long)end - (long)buff;
            if ((long)uVar26 <= lVar12) {
              *plVar27 = *plVar27 + uVar26;
              buff = buff + uVar26;
              goto LAB_001c8d15;
            }
            *plVar27 = *plVar27 + lVar12;
            this_01->m_lastPID = 0;
            this_01->m_lastPesLen = (uint)uVar4 - (int)lVar12;
            local_238 = 0;
            bVar28 = false;
          }
          else {
            if ((char)buff[7] < '\0') {
              uVar26 = (ulong)((ushort)(*(ushort *)(buff + 0xc) << 8 | *(ushort *)(buff + 0xc) >> 8)
                              >> 1) |
                       (ulong)((buff[0xb] & 0xfe) << 0xe | (uint)buff[10] << 0x16) |
                       (ulong)(buff[9] >> 1 & 7) << 0x1e;
              if ((this_01->m_firstPTS == -1) || ((long)uVar26 < this_01->m_firstPTS)) {
                this_01->m_firstPTS = uVar26;
              }
              if ((((local_23c & 0xfffffff0) == 0xe0 || local_23c - 0x55 < 0xb) ||
                  (((ulong)this_01->m_psm_es_type[local_23c & 0xff] < 0x34 &&
                   ((0x8001108000000U >> ((ulong)this_01->m_psm_es_type[local_23c & 0xff] & 0x3f) &
                    1) != 0)))) &&
                 ((this_01->m_firstVideoPTS == -1 || ((long)uVar26 < this_01->m_firstVideoPTS)))) {
                this_01->m_firstVideoPTS = uVar26;
              }
              p_Var14 = local_1c8;
              for (p_Var16 = (this_01->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent; (_Rb_tree_header *)p_Var16 != (_Rb_tree_header *)0x0;
                  p_Var16 = (&p_Var16->_M_left)[(int)*(size_t *)(p_Var16 + 1) < (int)local_23c]) {
                if ((int)local_23c <= (int)*(size_t *)(p_Var16 + 1)) {
                  p_Var14 = (_Rb_tree_header *)p_Var16;
                }
              }
              p_Var17 = local_1c8;
              if ((p_Var14 != local_1c8) &&
                 (p_Var17 = p_Var14, (int)local_23c < (int)p_Var14->_M_node_count)) {
                p_Var17 = local_1c8;
              }
              if ((p_Var17 == local_1c8) ||
                 (pmVar7 = std::
                           map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                           ::operator[](local_1f0,(key_type_conflict *)&local_23c),
                 (long)uVar26 < *pmVar7)) {
                puVar8 = (ulong *)std::
                                  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                                  ::operator[](local_1f0,(key_type_conflict *)&local_23c);
                *puVar8 = uVar26;
              }
            }
            pmVar6 = std::
                     map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                     ::operator[](this_00,(key_type_conflict *)&local_23c);
            if (((local_23c & 0xfffffff0) == 0xa0) &&
               (uVar18 = local_23c - 0xa0, this_01->m_lpcpHeaderAdded[uVar18] == false)) {
              sVar23 = local_1b8[uVar18].m_size;
              if (sVar23 != 0) {
                puVar3 = local_1b8[uVar18].m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_230 = (pointer)0x0;
                if (puVar3 != local_1b8[uVar18].m_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                  local_230 = puVar3;
                }
                MemoryBlock::grow(pmVar6,sVar23);
                memcpy((pmVar6->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + (pmVar6->m_size - sVar23),local_230,sVar23
                      );
              }
              this_01->m_lpcpHeaderAdded[uVar18] = true;
            }
            pbVar21 = buff + (ulong)(byte)(buff[8] + 9) + (long)local_21c;
            uVar15 = *(ushort *)(buff + 4) << 8 | *(ushort *)(buff + 4) >> 8;
            uVar4 = uVar15 + 6;
            if (uVar15 == 0) {
              uVar4 = 0;
            }
            uVar22 = (uint)uVar4 - ((uint)(byte)(buff[8] + 9) + local_21c);
            uVar24 = (int)end - (int)pbVar21;
            uVar18 = uVar24;
            if ((int)uVar22 < (int)uVar24) {
              uVar18 = uVar22;
            }
            local_230 = buff;
            if ((int)uVar18 < 0) {
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid copyLen",0xf);
              puVar11 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar11 = 3;
              *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
              if (local_1e8 == &local_1d8) {
                puVar11[6] = local_1d8;
                puVar11[7] = uStack_1d4;
                puVar11[8] = uStack_1d0;
                puVar11[9] = uStack_1cc;
              }
              else {
                *(uint **)(puVar11 + 2) = local_1e8;
                *(ulong *)(puVar11 + 6) = CONCAT44(uStack_1d4,local_1d8);
              }
              *(undefined8 *)(puVar11 + 4) = local_1e0;
              local_1e0 = 0;
              local_1d8 = local_1d8 & 0xffffff00;
              local_1e8 = &local_1d8;
              __cxa_throw(puVar11,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            uVar26 = (ulong)uVar18;
            if (uVar18 != 0) {
              local_1c0 = pmVar6;
              MemoryBlock::grow(pmVar6,uVar26);
              memcpy((local_1c0->m_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + (local_1c0->m_size - uVar26),pbVar21,uVar26)
              ;
            }
            local_210->m_dataProcessed = local_210->m_dataProcessed + uVar26;
            *local_200 = (long)(pbVar21 + (*local_200 - (long)local_230));
            if ((int)uVar24 < (int)uVar22) {
              local_210->m_lastPesLen = uVar22 - uVar18;
              local_210->m_lastPID = local_23c;
              local_238 = 0;
            }
            else {
              uVar4 = *(ushort *)(local_230 + 4) << 8 | *(ushort *)(local_230 + 4) >> 8;
              uVar18 = uVar4 + 6;
              if (uVar4 == 0) {
                uVar18 = 0;
              }
              local_230 = local_230 + ((ulong)uVar18 & 0xffff);
            }
            pPVar19 = local_208;
            this_00 = local_218;
            this_01 = local_210;
            buff = local_230;
            plVar27 = local_200;
            if ((int)uVar24 < (int)uVar22) {
              bVar28 = false;
            }
            else {
LAB_001c8d15:
              bVar28 = true;
            }
          }
          iVar5 = 1;
          pbVar21 = local_228;
          if (bVar28) goto LAB_001c8d20;
        }
      }
LAB_001c8d68:
    } while (iVar5 == 0);
    uVar18 = local_238;
    if (iVar5 == 3) {
LAB_001c8d80:
      uVar25 = (uint32_t)((long)end - (long)buff);
      this_01->m_tmpBufferLen = uVar25;
      uVar18 = 0;
      if (uVar25 != 0) {
        memmove(this_01->m_tmpBuffer,buff,(long)end - (long)buff);
      }
    }
  }
  return uVar18;
}

Assistant:

int ProgramStreamDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    discardSize = 0;
    uint32_t readedBytes = 0;
    int readRez = 0;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);

    m_lastReadRez = readRez;
    data += MAX_PES_HEADER_SIZE;
    assert(m_tmpBufferLen <= MAX_PES_HEADER_SIZE);
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += m_tmpBufferLen;
        m_tmpBufferLen = 0;
    }

    uint8_t* end = data + readedBytes;
    uint8_t* curBuf = data;

    if (m_lastPesLen > 0)
    {
        const int copyLen = FFMIN(readedBytes, m_lastPesLen);
        if (m_lastPID > 0)
        {
            StreamData& vect = demuxedData[m_lastPID];
            vect.append(curBuf, copyLen);
            m_dataProcessed += copyLen;
        }
        else
            discardSize += copyLen;
        curBuf += copyLen;
        m_lastPesLen -= copyLen;
        if (m_lastPesLen > 0)
        {
            if (readedBytes > 0)
                return 0;
            return BufferedReader::DATA_EOF;
        }
    }

    const uint8_t* prevBuf = curBuf;
    curBuf = MPEGHeader::findNextMarker(curBuf, end);
    discardSize += curBuf - prevBuf;

    while (curBuf <= end - 9)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curBuf);
        int startcode = curBuf[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if (curBuf + pesPacket->getHeaderLength() + 4 > end)
                break;
            int afterPesHeader = 0;
            startcode = processPES(curBuf, end, afterPesHeader);
            if (acceptedPIDs.find(startcode) != acceptedPIDs.end())
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t curPts = pesPacket->getPts();
                    if (m_firstPTS == -1 || curPts < m_firstPTS)
                        m_firstPTS = curPts;
                    if (isVideoPID(startcode) && (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS))
                        m_firstVideoPTS = curPts;
                    if (m_firstPtsTime.find(startcode) == m_firstPtsTime.end() || curPts < m_firstPtsTime[startcode])
                        m_firstPtsTime[startcode] = curPts;
                }

                StreamData& vect = demuxedData[startcode];

                const int idx = startcode - 0xa0;
                if (idx >= 0 && idx <= 15 && !m_lpcpHeaderAdded[idx])
                {
                    vect.append(m_lpcmWaveHeader[idx].data(), m_lpcmWaveHeader[idx].size());
                    m_lpcpHeaderAdded[idx] = true;
                }

                const uint8_t* payloadData = curBuf + pesPacket->getHeaderLength() + afterPesHeader;
                const int pesPayloadLen = pesPacket->getPacketLength() - pesPacket->getHeaderLength() - afterPesHeader;
                const int copyLen = FFMIN(pesPayloadLen, (int)(end - payloadData));
                if (copyLen < 0)
                {
                    THROW(ERR_COMMON, "Invalid copyLen")
                }
                vect.append(payloadData, copyLen);
                m_dataProcessed += copyLen;
                discardSize += payloadData - curBuf;
                if (copyLen < pesPayloadLen)
                {
                    m_lastPesLen = pesPayloadLen - copyLen;
                    m_lastPID = startcode;
                    return 0;
                }
                curBuf += pesPacket->getPacketLength();
            }
            else
            {
                const int tmpLen = pesPacket->getPacketLength();
                if (tmpLen > end - curBuf)
                {
                    discardSize += end - curBuf;
                    m_lastPID = 0;
                    m_lastPesLen = tmpLen - static_cast<int>(end - curBuf);
                    return 0;
                }
                curBuf += tmpLen;
                discardSize += tmpLen;
            }
        }
        else if (startcode == PES_PROGRAM_STREAM_MAP)
        {
            const int psmLen = mpegps_psm_parse(curBuf, end);
            if (psmLen == -1)
                break;
            if (psmLen > end - curBuf)
            {
                discardSize += end - curBuf;
                m_lastPID = 0;
                m_lastPesLen = psmLen - static_cast<int>(end - curBuf);
                return 0;
            }
            discardSize += psmLen;
            curBuf += psmLen;
        }
        else
        {
            const int64_t rest = FFMIN(end - curBuf, 4);
            curBuf += rest;
            discardSize += rest;
        }
        prevBuf = curBuf;
        curBuf = MPEGHeader::findNextMarker(curBuf, end);
        discardSize += curBuf - prevBuf;
    }
    m_tmpBufferLen = static_cast<uint32_t>(end - curBuf);
    if (m_tmpBufferLen > 0)
        memmove(m_tmpBuffer, curBuf, end - curBuf);
    return 0;
}